

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemsave.c
# Opt level: O0

LispPTR vmem_save0(LispPTR *args)

{
  int iVar1;
  __uid_t _Var2;
  LispPTR *pLVar3;
  ulong uVar4;
  DLword *pDVar5;
  char *__src;
  passwd *ppVar6;
  LispPTR local_217c;
  ulong local_2178;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp;
  passwd *pwd;
  char host [255];
  char sysout [4096];
  char pathname [4096];
  char *def;
  LispPTR *args_local;
  
  Lisp_errno = &Dummy_errno;
  if ((*args == 0) || (iVar1 = lispstringP(*args), iVar1 == 0)) {
    __src = getenv("LDEDESTSYSOUT");
    if (__src == (char *)0x0) {
      _Var2 = getuid();
      ppVar6 = getpwuid(_Var2);
      if (ppVar6 == (passwd *)0x0) {
        return 0xe0006;
      }
      strcpy(host + 0xf8,ppVar6->pw_dir);
      strcat(host + 0xf8,"/lisp.virtualmem");
    }
    else if ((*__src == '~') && ((__src[1] == '/' || (__src[1] == '\0')))) {
      _Var2 = getuid();
      ppVar6 = getpwuid(_Var2);
      if (ppVar6 == (passwd *)0x0) {
        return 0xe0006;
      }
      strcpy(host + 0xf8,ppVar6->pw_dir);
      strcat(host + 0xf8,__src + 1);
    }
    else {
      strcpy(host + 0xf8,__src);
    }
    args_local._4_4_ = vmem_save(host + 0xf8);
  }
  else {
    pLVar3 = NativeAligned4FromLAddr(*args);
    if ((int)pLVar3[2] < 0x1000) {
      local_217c = pLVar3[2];
    }
    else {
      local_217c = 0x1000;
    }
    uVar4 = (ulong)(int)local_217c;
    if (*(char *)((long)pLVar3 + 6) == 'C') {
      pDVar5 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
      lf_i = (size_t)(sysout + 0xff8);
      lf_dptr = (char *)((long)pDVar5 + (long)(int)(uint)(ushort)pLVar3[1]);
      for (lf_ii = 0; lf_ii < uVar4; lf_ii = lf_ii + 1) {
        *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
        lf_i = lf_i + 1;
        lf_dptr = lf_dptr + 1;
      }
      sysout[uVar4 + 0xff8] = '\0';
    }
    else if (*(char *)((long)pLVar3 + 6) == 'D') {
      pDVar5 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
      lf_length = (size_t)(pDVar5 + (int)(uint)(ushort)pLVar3[1]);
      lf_sbase = (short *)(sysout + 0xff8);
      for (local_2178 = 0; local_2178 < uVar4; local_2178 = local_2178 + 1) {
        *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
        lf_length = lf_length + 2;
        lf_sbase = (short *)((long)lf_sbase + 1);
      }
      *(undefined1 *)lf_sbase = 0;
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    separate_host(sysout + 0xff8,(char *)&pwd);
    iVar1 = unixpathname(sysout + 0xff8,host + 0xf8,0,0);
    if (iVar1 == 0) {
      args_local._4_4_ = 0xe0001;
    }
    else {
      args_local._4_4_ = vmem_save(host + 0xf8);
    }
  }
  return args_local._4_4_;
}

Assistant:

LispPTR vmem_save0(LispPTR *args)
{
  char *def;
  char pathname[MAXPATHLEN], sysout[MAXPATHLEN], host[MAXNAMLEN];
#ifdef DOS
  char pwd[MAXNAMLEN];
  char drive[1];
#else
  struct passwd *pwd;
#endif /* DOS */

  Lisp_errno = &Dummy_errno;

  if ((args[0] != NIL) && lispstringP(args[0])) {
    /* Check of lispstringP is safer for LispStringToCString */
    LispStringToCString(args[0], pathname, MAXPATHLEN);
    separate_host(pathname, host);
#ifdef DOS
    if (!unixpathname(pathname, sysout, 0, 0, drive, 0, 0)) return (BADFILENAME);
#else
    if (!unixpathname(pathname, sysout, 0, 0)) return (BADFILENAME);
#endif /* DOS */
    return (vmem_save(sysout));
  } else {
    if ((def = getenv("LDEDESTSYSOUT")) == 0) {
#ifdef DOS
      if (getcwd(pwd, MAXNAMLEN) == NULL) return (FILETIMEOUT);
      strcpy(sysout, pwd);
      strcat(sysout, "/lisp.vm");
#else
      pwd = getpwuid(getuid()); /* NEED TIMEOUT */
      if (pwd == (struct passwd *)NULL) return (FILETIMEOUT);
      strcpy(sysout, pwd->pw_dir);
      strcat(sysout, "/lisp.virtualmem");
#endif /* DOS */
    } else {
      if (*def == '~' && (*(def + 1) == '/' || *(def + 1) == '\0')) {
#ifdef DOS
        if (getcwd(pwd, MAXNAMLEN) == NULL) return (FILETIMEOUT);
        strcpy(sysout, pwd);
#else
        pwd = getpwuid(getuid()); /* NEED TIMEOUT */
        if (pwd == (struct passwd *)NULL) return (FILETIMEOUT);
        strcpy(sysout, pwd->pw_dir);
#endif /* DOS */
        strcat(sysout, def + 1);
      } else {
        strcpy(sysout, def);
      }
    }
    return (vmem_save(sysout));
  }
}